

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int memory_equal_display_error(char *a,char *b,size_t size)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = 0;
  for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
    if (a[sVar2] != b[sVar2]) {
      if (uVar3 < 0x10) {
        cm_print_error("difference at offset %zd 0x%02x 0x%02x\n",sVar2);
      }
      uVar3 = uVar3 + 1;
    }
  }
  if (uVar3 == 0) {
    iVar1 = 1;
  }
  else {
    if (0xf < uVar3) {
      cm_print_error("...\n");
    }
    iVar1 = 0;
    cm_print_error("%zd bytes of %p and %p differ\n",uVar3,a,b);
  }
  return iVar1;
}

Assistant:

static int memory_equal_display_error(const char* const a, const char* const b,
                                      const size_t size) {
    size_t differences = 0;
    size_t i;
    for (i = 0; i < size; i++) {
        const char l = a[i];
        const char r = b[i];
        if (l != r) {
            if (differences < 16) {
                cm_print_error("difference at offset %" PRIdS " 0x%02x 0x%02x\n",
                               i, l, r);
            }
            differences ++;
        }
    }
    if (differences > 0) {
        if (differences >= 16) {
            cm_print_error("...\n");
        }
        cm_print_error("%"PRIdS " bytes of %p and %p differ\n",
                       differences, (void *)a, (void *)b);
        return 0;
    }
    return 1;
}